

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Apu.cpp
# Opt level: O0

int __thiscall Nes_Apu::read_status(Nes_Apu *this,cpu_time_t time)

{
  uint uVar1;
  Nes_Apu *in_RSI;
  Nes_Apu *in_RDI;
  int i;
  int result;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffec;
  
  run_until(in_RSI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  uVar1 = (uint)((in_RDI->dmc).irq_flag & 1) << 7 | (uint)(in_RDI->irq_flag & 1) << 6;
  for (iVar2 = 0; iVar2 < 5; iVar2 = iVar2 + 1) {
    if (in_RDI->oscs[iVar2]->length_counter != 0) {
      uVar1 = 1 << ((byte)iVar2 & 0x1f) | uVar1;
    }
  }
  run_until(in_RSI,CONCAT44(uVar1,iVar2));
  if ((in_RDI->irq_flag & 1U) != 0) {
    in_RDI->irq_flag = false;
    irq_changed(in_RDI);
  }
  return uVar1;
}

Assistant:

int Nes_Apu::read_status( cpu_time_t time )
{
	run_until( time - 1 );
	
	int result = (dmc.irq_flag << 7) | (irq_flag << 6);
	
	for ( int i = 0; i < osc_count; i++ )
		if ( oscs [i]->length_counter )
			result |= 1 << i;
	
	run_until( time );
	
	if ( irq_flag ) {
		irq_flag = false;
		irq_changed();
	}
	
	return result;
}